

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::CreateImportedGenerationObjects
          (cmGlobalGenerator *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   *exports)

{
  pointer *pppcVar1;
  cmLocalGenerator *this_00;
  iterator __position;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_> _Var2;
  pointer name;
  cmGeneratorTarget *gt;
  cmGeneratorTarget *local_38;
  cmMakefile *local_30;
  
  local_30 = mf;
  CreateLocalGenerators(this);
  CreateGeneratorTargets(this,ImportedOnly);
  ComputeBuildFileGenerators(this);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<cmMakefile**,std::vector<cmMakefile*,std::allocator<cmMakefile*>>>,__gnu_cxx::__ops::_Iter_equals_val<cmMakefile*const>>
                    ((this->Makefiles).
                     super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->Makefiles).
                     super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_30);
  name = (targets->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if (name != (targets->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = *(cmLocalGenerator **)
               ((long)_Var2._M_current +
               ((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_start -
               (long)(this->Makefiles).
                     super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                     super__Vector_impl_data._M_start));
    do {
      local_38 = cmLocalGenerator::FindGeneratorTargetToUse(this_00,name);
      if (local_38 != (cmGeneratorTarget *)0x0) {
        __position._M_current =
             (exports->
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (exports->
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
          _M_realloc_insert<cmGeneratorTarget_const*const&>
                    ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                     exports,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppcVar1 = &(exports->
                      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      name = name + 1;
    } while (name != (targets->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateImportedGenerationObjects(
  cmMakefile* mf, const std::vector<std::string>& targets,
  std::vector<const cmGeneratorTarget*>& exports)
{
  this->CreateGenerationObjects(ImportedOnly);
  std::vector<cmMakefile*>::iterator mfit =
    std::find(this->Makefiles.begin(), this->Makefiles.end(), mf);
  cmLocalGenerator* lg =
    this->LocalGenerators[std::distance(this->Makefiles.begin(), mfit)];
  for (std::vector<std::string>::const_iterator it = targets.begin();
       it != targets.end(); ++it) {
    cmGeneratorTarget* gt = lg->FindGeneratorTargetToUse(*it);
    if (gt) {
      exports.push_back(gt);
    }
  }
}